

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O3

STRING_HANDLE URL_EncodeString(char *textEncode)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  char *memory;
  STRING_HANDLE pSVar4;
  LOGGER_LOG p_Var5;
  byte bVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  ulong __size;
  
  if (textEncode == (char *)0x0) {
    return (STRING_HANDLE)0x0;
  }
  __size = 0;
  pbVar3 = (byte *)textEncode;
LAB_00130b1f:
  do {
    while( true ) {
      bVar1 = *pbVar3;
      uVar8 = 0xfffffffffffffffe;
      if ((((0x2e < (ulong)bVar1) || ((0x670200000001U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
          (9 < (byte)(bVar1 - 0x30))) && ((bVar1 != 0x5f && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))
         ) {
        uVar8 = (ulong)(-1 < (char)bVar1) * 3 - 7;
      }
      pbVar3 = pbVar3 + 1;
      if (__size < uVar8) break;
      __size = 0xffffffffffffffff;
      if (bVar1 == 0) goto LAB_00130d23;
    }
    lVar9 = 1;
    if ((0x2e < bVar1) || ((0x670200000001U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      if ((byte)(bVar1 - 0x30) < 10) {
        __size = __size + 1;
        goto LAB_00130b1f;
      }
      if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
        lVar9 = (ulong)(bVar1 >> 7) * 3 + 3;
      }
    }
    __size = __size + lVar9;
    if (bVar1 == 0) {
      if (__size == 0xffffffffffffffff) {
        __size = 0xffffffffffffffff;
      }
      else {
        memory = (char *)malloc(__size);
        if (memory != (char *)0x0) {
          lVar9 = 0;
          do {
            bVar1 = *textEncode;
            if (((((ulong)bVar1 < 0x2f) && ((0x670200000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                ((byte)(bVar1 - 0x30) < 10)) ||
               ((bVar1 == 0x5f || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)))) {
              memory[lVar9] = bVar1;
              lVar10 = 1;
            }
            else {
              bVar6 = bVar1 & 0xf;
              bVar2 = (bVar1 >> 4) - 4;
              if (bVar1 < 0xc0) {
                bVar2 = bVar1 >> 4;
              }
              bVar11 = bVar2 + 0x57;
              if (bVar2 < 10) {
                bVar11 = bVar2 | 0x30;
              }
              cVar7 = bVar6 + 0x57;
              if (bVar6 < 10) {
                cVar7 = bVar6 + 0x30;
              }
              memory[lVar9] = '%';
              if ((char)bVar1 < '\0') {
                memory[lVar9 + 1] = 'c';
                memory[lVar9 + 3] = '%';
                memory[lVar9 + 4] = bVar11;
                memory[lVar9 + 5] = cVar7;
                if (bVar1 < 0xc0) {
                  memory[lVar9 + 2] = '2';
                }
                else {
                  memory[lVar9 + 2] = '3';
                }
                lVar10 = 6;
              }
              else {
                memory[lVar9 + 1] = bVar11;
                memory[lVar9 + 2] = cVar7;
                lVar10 = 3;
              }
            }
            textEncode = (char *)((byte *)textEncode + 1);
            lVar9 = lVar9 + lVar10;
          } while (bVar1 != 0);
          pSVar4 = STRING_new_with_memory(memory);
          if (pSVar4 == (STRING_HANDLE)0x0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                        ,"encode_url_data",0x101,1,"URL_Encode:: MALLOC failure on encode.");
            }
            free(memory);
            return (STRING_HANDLE)0x0;
          }
          return pSVar4;
        }
      }
LAB_00130d23:
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                  ,"encode_url_data",0xf2,1,"URL_Encode:: MALLOC failure on encode. size=%zu",__size
                 );
      }
      return (STRING_HANDLE)0x0;
    }
  } while( true );
}

Assistant:

STRING_HANDLE URL_EncodeString(const char* textEncode)
{
    STRING_HANDLE result;
    if (textEncode == NULL)
    {
        result = NULL;
    }
    else
    {
        result = encode_url_data(textEncode);
    }
    return result;
}